

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

void __thiscall Rml::Element::SetOwnerDocument(Element *this,ElementDocument *document)

{
  pointer puVar1;
  Context *this_00;
  ElementPtr *child;
  pointer puVar2;
  
  if (document == (ElementDocument *)0x0 && this->owner_document != (ElementDocument *)0x0) {
    this_00 = ElementDocument::GetContext(this->owner_document);
    if (this_00 != (Context *)0x0) {
      Context::OnElementDetach(this_00,this);
    }
  }
  if (this->owner_document != document && this->owner_document != (ElementDocument *)this) {
    this->owner_document = document;
    puVar1 = (this->children).
             super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar2 = (this->children).
                  super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1)
    {
      SetOwnerDocument((puVar2->_M_t).
                       super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                       super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                       super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,document);
    }
  }
  return;
}

Assistant:

void Element::SetOwnerDocument(ElementDocument* document)
{
	if (owner_document && !document)
	{
		// We are detaching from the document and thereby also the context.
		if (Context* context = owner_document->GetContext())
			context->OnElementDetach(this);
	}

	// If this element is a document, then never change owner_document.
	if (owner_document != this && owner_document != document)
	{
		owner_document = document;
		for (ElementPtr& child : children)
			child->SetOwnerDocument(document);
	}
}